

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O2

energy_t __thiscall
W_final::E_ext_Stem(W_final *this,energy_t *vij,energy_t *vi1j,energy_t *vij1,energy_t *vi1j1,
                   short *S,paramT *params,cand_pos_t i,cand_pos_t j,cand_pos_t n,
                   vector<Node,_std::allocator<Node>_> *tree)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  pointer pNVar8;
  long lVar9;
  long lVar10;
  
  lVar9 = (long)i;
  lVar10 = (long)j;
  pNVar8 = (tree->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (((pNVar8[lVar9].pair < -1) && (pNVar8[lVar10].pair < -1)) ||
     ((iVar5 = 10000000, pNVar8[lVar9].pair == j && (pNVar8[lVar10].pair == i)))) {
    iVar4 = *vij;
    iVar5 = 10000000;
    if (iVar4 != 10000000) {
      if ((params->model_details).dangles == 2) {
        iVar5 = -1;
        iVar7 = iVar5;
        if (1 < i) {
          iVar7 = (int)S[(ulong)(uint)i - 1];
        }
        if (j < n) {
          iVar5 = (int)S[lVar10 + 1];
        }
      }
      else {
        iVar5 = -1;
        iVar7 = iVar5;
      }
      iVar5 = vrna_E_ext_stem((int)(short)pair[S[lVar9]][S[lVar10]],iVar7,iVar5,params);
      iVar5 = iVar5 + iVar4;
      if (9999999 < iVar5) {
        iVar5 = 10000000;
      }
    }
  }
  if ((params->model_details).dangles != 1) {
    return iVar5;
  }
  lVar1 = lVar9 + 1;
  pNVar8 = (tree->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar4 = pNVar8[lVar1].pair;
  if (iVar4 < -1) {
    if ((iVar4 == j) || (pNVar8[lVar10].pair < -1)) {
LAB_0010558d:
      if (pNVar8[lVar9].pair < 0) {
        iVar4 = *vi1j;
        iVar7 = 10000000;
        if (iVar4 != 10000000 && i - j < -4) {
          iVar7 = vrna_E_ext_stem((int)(short)pair[S[lVar9 + 1]][S[lVar10]],(int)S[lVar9],-1,params)
          ;
          iVar7 = iVar7 + iVar4;
          pNVar8 = (tree->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        if (iVar7 <= iVar5) {
          iVar5 = iVar7;
        }
      }
    }
  }
  else if (iVar4 == j) goto LAB_0010558d;
  lVar2 = lVar10 + -1;
  lVar6 = (long)S[lVar10 + -1];
  iVar4 = pNVar8[lVar9].pair;
  iVar7 = (int)lVar2;
  if (iVar4 < -1) {
    if ((iVar4 != iVar7) && (-2 < pNVar8[lVar2].pair)) goto LAB_001056d9;
  }
  else if (iVar4 != iVar7) goto LAB_001056d9;
  if (pNVar8[lVar10].pair < 0) {
    iVar4 = *vij1;
    iVar3 = 10000000;
    if (iVar4 != 10000000 && 3 < iVar7 - i) {
      iVar3 = vrna_E_ext_stem((int)(short)pair[S[lVar9]][lVar6],-1,(int)S[lVar10],params);
      iVar3 = iVar3 + iVar4;
      lVar6 = (long)S[lVar2];
      pNVar8 = (tree->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    if (iVar3 <= iVar5) {
      iVar5 = iVar3;
    }
  }
LAB_001056d9:
  iVar4 = pNVar8[lVar1].pair;
  if (iVar4 < -1) {
    if ((iVar4 != iVar7) && (-2 < pNVar8[lVar2].pair)) {
      return iVar5;
    }
  }
  else if (iVar4 != iVar7) {
    return iVar5;
  }
  iVar4 = iVar5;
  if ((pNVar8[lVar9].pair < 0) && (pNVar8[lVar10].pair < 0)) {
    iVar3 = *vi1j1;
    iVar4 = 10000000;
    if (iVar3 != 10000000 && i - iVar7 < -4) {
      iVar4 = vrna_E_ext_stem((int)(short)pair[S[lVar1]][lVar6],(int)S[lVar9],(int)S[lVar10],params)
      ;
      iVar4 = iVar4 + iVar3;
    }
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

energy_t W_final::E_ext_Stem(const energy_t& vij,const energy_t& vi1j,const energy_t& vij1,const energy_t& vi1j1,const short* S, paramT* params, const cand_pos_t i,const cand_pos_t j, cand_pos_t n, std::vector<Node> &tree){

	energy_t e = INF,en = INF;
  	pair_type tt  = pair[S[i]][S[j]];
	
    if ((tree[i].pair <-1 && tree[j].pair <-1) || (tree[i].pair == j && tree[j].pair == i)) {
				en = vij; // i j

				if (en != INF) {
					if (params->model_details.dangles == 2){
						base_type si1 = i>1 ? S[i-1] : -1;
                		base_type sj1 = j<n ? S[j+1] : -1;
                        en += vrna_E_ext_stem(tt, si1, sj1, params);
					}
                    else{
                        en += vrna_E_ext_stem(tt, -1, -1, params);
					}

                    e = MIN2(e, en);
					
				}

	}

	if(params->model_details.dangles  == 1){
        tt  = pair[S[i+1]][S[j]];
        if (((tree[i+1].pair <-1 && tree[j].pair <-1) || (tree[i+1].pair == j)) && tree[i].pair<0) {
            en = (j-i-1>TURN) ? vi1j : INF; //i+1 j

            if (en != INF) {

                base_type si1 = S[i];
                en += vrna_E_ext_stem(tt, si1, -1, params);
            }

            e = MIN2(e,en);

        }
        tt  = pair[S[i]][S[j-1]];
        if (((tree[i].pair <-1 && tree[j-1].pair <-1) || (tree[i].pair == j-1)) && tree[j].pair<0) {
            en = (j-1-i>TURN) ? vij1 : INF; // i j-1
            if (en != INF) {

                base_type sj1 = S[j];

                en += vrna_E_ext_stem(tt, -1, sj1, params);
            }
            e = MIN2(e,en);

        }
        tt  = pair[S[i+1]][S[j-1]];
        if (((tree[i+1].pair <-1 && tree[j-1].pair <-1) || (tree[i+1].pair == j-1)) && tree[i].pair < 0 && tree[j].pair<0) {
            en = (j-1-i-1>TURN) ? vi1j1 : INF; // i+1 j-1

            if (en != INF) {

                base_type si1 = S[i];
                base_type sj1 = S[j];

                en += vrna_E_ext_stem(tt, si1, sj1, params);
            }
            e = MIN2(e,en);
        }
	}
	return e;
}